

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall FastPForLib::FastPFor<4U>::~FastPFor(FastPFor<4U> *this)

{
  FastPForImpl<4U,_unsigned_int> *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_encodeArray_004788c8;
  FastPForImpl<4U,_unsigned_long>::~FastPForImpl((FastPForImpl<4U,_unsigned_long> *)in_RDI);
  FastPForImpl<4U,_unsigned_int>::~FastPForImpl(in_RDI);
  IntegerCODEC::~IntegerCODEC((IntegerCODEC *)in_RDI);
  return;
}

Assistant:

FastPFor(uint32_t pageSize = 65536) : pfor32(pageSize) {}